

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall MODEL3D::three_dim_model::tidy_path(three_dim_model *this,Path *input_path)

{
  long lVar1;
  bool bVar2;
  iterator __x;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  _Var3;
  pointer pIVar4;
  reference pIVar5;
  double dVar6;
  const_iterator local_148;
  IntPoint *local_140;
  IntPoint *local_138;
  double local_130;
  double dist_2;
  double delta_y_sqr_2;
  double delta_x_sqr_2;
  IntPoint curr_pt_1;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  local_100;
  long local_f8;
  IntPoint prev_pt_1;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  path_it_1;
  double tolerance;
  double dist;
  IntPoint *local_c8;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  local_c0;
  __type_conflict local_b8;
  double delta_y_sqr;
  IntPoint *local_a8;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  local_a0;
  __type_conflict local_98;
  double delta_x_sqr;
  double local_88;
  double dist_1;
  double delta_y_sqr_1;
  double delta_x_sqr_1;
  IntPoint curr_pt;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  local_58;
  long local_50;
  IntPoint prev_pt;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  path_it;
  iterator path_end;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  perim_start;
  double path_perimeter;
  Path *input_path_local;
  three_dim_model *this_local;
  
  perim_start._M_current = (IntPoint *)0x0;
  __x = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin(input_path);
  _Var3 = std::
          next<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                    (__x._M_current,1);
  path_it._M_current =
       (IntPoint *)
       std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end(input_path);
  prev_pt.Y = (cInt)_Var3;
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                             *)&prev_pt.Y,&path_it), bVar2) {
    curr_pt.Y = prev_pt.Y;
    local_58 = std::
               prev<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                         ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                           )prev_pt.Y,1);
    pIVar5 = __gnu_cxx::
             __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
             ::operator*(&local_58);
    local_50 = pIVar5->X;
    prev_pt.X = pIVar5->Y;
    pIVar5 = __gnu_cxx::
             __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
             ::operator*((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                          *)&prev_pt.Y);
    delta_x_sqr_1 = (double)pIVar5->X;
    curr_pt.X = pIVar5->Y;
    delta_y_sqr_1 = std::pow<long_long,int>((long)delta_x_sqr_1 - local_50,2);
    dist_1 = std::pow<long_long,int>(curr_pt.X - prev_pt.X,2);
    local_88 = sqrt(delta_y_sqr_1 + dist_1);
    perim_start._M_current = (IntPoint *)(perim_start._M_current + local_88);
    delta_x_sqr = (double)__gnu_cxx::
                          __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                          ::operator++((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                                        *)&prev_pt.Y,0);
  }
  local_a8 = (IntPoint *)
             std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                       (input_path);
  local_a0 = std::
             prev<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                       ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                         )local_a8,1);
  pIVar4 = __gnu_cxx::
           __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
           ::operator->(&local_a0);
  lVar1 = pIVar4->X;
  delta_y_sqr = (double)std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                        begin(input_path);
  pIVar4 = __gnu_cxx::
           __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
           ::operator->((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                         *)&delta_y_sqr);
  local_98 = std::pow<long_long,int>(lVar1 - pIVar4->X,2);
  local_c8 = (IntPoint *)
             std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                       (input_path);
  local_c0 = std::
             prev<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                       ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                         )local_c8,1);
  pIVar4 = __gnu_cxx::
           __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
           ::operator->(&local_c0);
  lVar1 = pIVar4->Y;
  dist = (double)std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                           (input_path);
  pIVar4 = __gnu_cxx::
           __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
           ::operator->((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                         *)&dist);
  local_b8 = std::pow<long_long,int>(lVar1 - pIVar4->Y,2);
  dVar6 = sqrt(local_98 + local_b8);
  path_it_1._M_current =
       (IntPoint *)ceil(((double)perim_start._M_current + dVar6) * 0.031415926535897934);
  prev_pt_1.Y = (cInt)_Var3;
  if ((double)this->min_distance_between_points < (double)path_it_1._M_current) {
    path_it_1._M_current = (IntPoint *)(double)this->min_distance_between_points;
  }
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                             *)&prev_pt_1.Y,&path_it), bVar2) {
    curr_pt_1.Y = prev_pt_1.Y;
    local_100 = std::
                prev<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                          ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                            )prev_pt_1.Y,1);
    pIVar5 = __gnu_cxx::
             __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
             ::operator*(&local_100);
    local_f8 = pIVar5->X;
    prev_pt_1.X = pIVar5->Y;
    pIVar5 = __gnu_cxx::
             __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
             ::operator*((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                          *)&prev_pt_1.Y);
    delta_x_sqr_2 = (double)pIVar5->X;
    curr_pt_1.X = pIVar5->Y;
    delta_y_sqr_2 = std::pow<long_long,int>((long)delta_x_sqr_2 - local_f8,2);
    dist_2 = std::pow<long_long,int>(curr_pt_1.X - prev_pt_1.X,2);
    local_130 = sqrt(delta_y_sqr_2 + dist_2);
    if (local_130 < (double)path_it_1._M_current) {
      __gnu_cxx::
      __normal_iterator<ClipperLib::IntPoint_const*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>
      ::__normal_iterator<ClipperLib::IntPoint*>
                ((__normal_iterator<ClipperLib::IntPoint_const*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>
                  *)&local_148,
                 (__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                  *)&prev_pt_1.Y);
      local_140 = (IntPoint *)
                  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::erase
                            (input_path,local_148);
      local_138 = (IntPoint *)
                  std::
                  prev<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                            ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                              )local_140,1);
      prev_pt_1.Y = (cInt)local_138;
      path_it._M_current =
           (IntPoint *)
           std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end(input_path)
      ;
    }
    __gnu_cxx::
    __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
    ::operator++((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                  *)&prev_pt_1.Y,0);
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::tidy_path(ClipperLib::Path &input_path)
{
    //determine perimeter of path
    double path_perimeter = 0;
    auto perim_start = std::next(input_path.begin(),1);
    auto path_end = input_path.end();
    for (auto path_it = perim_start; path_it != path_end; path_it++)
    {
        ClipperLib::IntPoint prev_pt = *std::prev(path_it);
        ClipperLib::IntPoint curr_pt = *path_it;
        double delta_x_sqr = std::pow((curr_pt.X - prev_pt.X), 2);
        double delta_y_sqr = std::pow((curr_pt.Y - prev_pt.Y), 2);
        double dist = std::sqrt(delta_x_sqr+delta_y_sqr);
        path_perimeter = path_perimeter + dist;
    }
    // last to first
    double delta_x_sqr = std::pow((std::prev(input_path.end(),1)->X - input_path.begin()->X), 2);
    double delta_y_sqr = std::pow((std::prev(input_path.end(),1)->Y - input_path.begin()->Y), 2);
    double dist = std::sqrt(delta_x_sqr+delta_y_sqr);
    path_perimeter = path_perimeter + dist;
    double tolerance = std::ceil(0.01*PI*path_perimeter);//1% of perimeter tolerance
    if(tolerance>min_distance_between_points)
        tolerance = min_distance_between_points;
    //remove bunched points
    for (auto path_it = perim_start; path_it != path_end; path_it++)
    {
        ClipperLib::IntPoint prev_pt = *std::prev(path_it);
        ClipperLib::IntPoint curr_pt = *path_it;
        double delta_x_sqr = std::pow((curr_pt.X - prev_pt.X), 2);
        double delta_y_sqr = std::pow((curr_pt.Y - prev_pt.Y), 2);
        double dist = std::sqrt(delta_x_sqr+delta_y_sqr);
        if(dist<tolerance)
        {
            //delete value, then move one back because loop steps you forward again
            path_it = std::prev(input_path.erase(path_it),1);
            path_end = input_path.end();
        }
    }
}